

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader::data__minfilter
          (LibraryEffectsLoader *this,ENUM__fx_sampler_filter_common value)

{
  undefined4 in_ESI;
  long in_RDI;
  SamplerFilter filter;
  SamplerFilter local_10;
  
  local_10 = SAMPLER_FILTER_UNSPECIFIED;
  if (*(long *)(in_RDI + 0x280) != 0) {
    switch(in_ESI) {
    case 0:
    case 7:
    case 8:
      local_10 = SAMPLER_FILTER_NONE;
      break;
    case 1:
      local_10 = SAMPLER_FILTER_NEAREST;
      break;
    case 2:
      local_10 = SAMPLER_FILTER_LINEAR;
      break;
    case 3:
      local_10 = SAMPLER_FILTER_NEAREST_MIPMAP_NEAREST;
      break;
    case 4:
      local_10 = SAMPLER_FILTER_LINEAR_MIPMAP_NEAREST;
      break;
    case 5:
      local_10 = SAMPLER_FILTER_NEAREST_MIPMAP_LINEAR;
      break;
    case 6:
      local_10 = SAMPLER_FILTER_LINEAR_MIPMAP_LINEAR;
    }
    COLLADAFW::Sampler::setMinFilter(*(Sampler **)(in_RDI + 0x280),local_10);
  }
  return true;
}

Assistant:

bool LibraryEffectsLoader::data__minfilter( const ENUM__fx_sampler_filter_common value )
    {
        COLLADAFW::Sampler::SamplerFilter filter = COLLADAFW::Sampler::SAMPLER_FILTER_UNSPECIFIED;
        if ( mCurrentSampler ) {
            switch (value) {
                case ENUM__fx_sampler_filter_common__NOT_PRESENT:
                case ENUM__fx_sampler_filter_common__COUNT:
                case ENUM__fx_sampler_filter_common__NONE:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_NONE;
                    break;
                case ENUM__fx_sampler_filter_common__NEAREST:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_NEAREST;
                    break;
                case ENUM__fx_sampler_filter_common__LINEAR:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_LINEAR;
                    break;
                case ENUM__fx_sampler_filter_common__NEAREST_MIPMAP_NEAREST:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_NEAREST_MIPMAP_NEAREST;
                    break;
                case ENUM__fx_sampler_filter_common__LINEAR_MIPMAP_NEAREST:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_LINEAR_MIPMAP_NEAREST;
                    break;
                case ENUM__fx_sampler_filter_common__NEAREST_MIPMAP_LINEAR:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_NEAREST_MIPMAP_LINEAR;
                    break;
                case ENUM__fx_sampler_filter_common__LINEAR_MIPMAP_LINEAR:
                    filter = COLLADAFW::Sampler::SAMPLER_FILTER_LINEAR_MIPMAP_LINEAR;
                    break;
            }
            mCurrentSampler->setMinFilter(filter);
        }
        
        return true;
    }